

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::UsingImplicitWeakDescriptor
               (FileDescriptor *file,Options *options)

{
  bool bVar1;
  byte local_19;
  Options *options_local;
  FileDescriptor *file_local;
  
  bVar1 = HasDescriptorMethods(file,options);
  local_19 = 0;
  if (bVar1) {
    bVar1 = IsBootstrapProto(options,file);
    local_19 = 0;
    if ((!bVar1) && (local_19 = 0, (options->descriptor_implicit_weak_messages & 1U) != 0)) {
      local_19 = options->opensource_runtime ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool UsingImplicitWeakDescriptor(const FileDescriptor* file,
                                 const Options& options) {
  return HasDescriptorMethods(file, options) &&
         !IsBootstrapProto(options, file) &&
         options.descriptor_implicit_weak_messages &&
         !options.opensource_runtime;
}